

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O1

AdaptorSignature *
cfd::core::AdaptorSignature::Encrypt
          (AdaptorSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          Pubkey *encryption_key)

{
  uchar *puVar1;
  _Alloc_hider seckey32;
  pointer adaptor_sig162;
  int iVar2;
  value_type_conflict *__val;
  secp256k1_context_struct *ctx;
  CfdException *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> adaptor_sig_raw;
  secp256k1_pubkey_conflict adaptor_key;
  string local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ByteData local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  ByteData local_88;
  secp256k1_pubkey_conflict local_70;
  
  ctx = wally_get_secp_context();
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0xa2);
  puVar1 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0xa2;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  memset(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,0,0xa2);
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  ParsePubkey(&local_70,encryption_key);
  adaptor_sig162 =
       local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  Privkey::GetData(&local_88,sk);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,&local_88);
  seckey32._M_p = local_f8._M_dataplus._M_p;
  ByteData256::GetData(&local_b8,msg);
  ByteData::GetBytes(&local_a0,&local_b8);
  iVar2 = secp256k1_ecdsa_adaptor_encrypt
                    (ctx,adaptor_sig162,(uchar *)seckey32._M_p,&local_70,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0,(void *)0x0);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_f8._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_f8._M_dataplus._M_p,
                    local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
  }
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar2 == 1) {
    ByteData::ByteData((ByteData *)&local_f8,&local_d8);
    AdaptorSignature(__return_storage_ptr__,(ByteData *)&local_f8);
    if ((uchar *)local_f8._M_dataplus._M_p != (uchar *)0x0) {
      operator_delete(local_f8._M_dataplus._M_p,
                      local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
    }
    if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Could not create adaptor signature.","");
  CfdException::CfdException(this,kCfdInternalError,&local_f8);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AdaptorSignature AdaptorSignature::Encrypt(
    const ByteData256 &msg, const Privkey &sk, const Pubkey &encryption_key) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> adaptor_sig_raw(
      AdaptorSignature::kAdaptorSignatureSize);
  auto adaptor_key = ParsePubkey(encryption_key);
  auto ret = secp256k1_ecdsa_adaptor_encrypt(
      ctx, adaptor_sig_raw.data(), sk.GetData().GetBytes().data(),
      &adaptor_key, msg.GetData().GetBytes().data(), nullptr, nullptr);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not create adaptor signature.");
  }

  return AdaptorSignature(adaptor_sig_raw);
}